

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

void __thiscall FTagManager::HashTags(FTagManager *this)

{
  int iVar1;
  uint uVar2;
  FTagItem *pFVar3;
  uint local_1c;
  int hash_1;
  int i_1;
  int hash;
  int i;
  FTagManager *this_local;
  
  TArray<FTagItem,_FTagItem>::Push(&this->allTags,&HashTags::it);
  TArray<FTagItem,_FTagItem>::Push(&this->allIDs,&HashTags::it);
  memset(this->TagHashFirst,0xff,0x400);
  memset(this->IDHashFirst,0xff,0x400);
  i_1 = TArray<FTagItem,_FTagItem>::Size(&this->allTags);
  while (i_1 = i_1 - 1, -1 < i_1) {
    pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)i_1);
    if (-1 < pFVar3->target) {
      pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)i_1);
      uVar2 = pFVar3->tag & 0xff;
      iVar1 = this->TagHashFirst[(int)uVar2];
      pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allTags,(long)i_1);
      pFVar3->nexttag = iVar1;
      this->TagHashFirst[(int)uVar2] = i_1;
    }
  }
  local_1c = TArray<FTagItem,_FTagItem>::Size(&this->allIDs);
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(long)(int)local_1c);
    if (-1 < pFVar3->target) {
      pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(long)(int)local_1c);
      uVar2 = pFVar3->tag & 0xff;
      iVar1 = this->IDHashFirst[(int)uVar2];
      pFVar3 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(long)(int)local_1c);
      pFVar3->nexttag = iVar1;
      this->IDHashFirst[(int)uVar2] = local_1c;
    }
  }
  return;
}

Assistant:

void FTagManager::HashTags()
{
	// add an end marker so we do not need to check for the array's size in the other functions.
	static FTagItem it = { -1, -1, -1 };
	allTags.Push(it);
	allIDs.Push(it);

	// Initially make all slots empty.
	memset(TagHashFirst, -1, sizeof(TagHashFirst));
	memset(IDHashFirst, -1, sizeof(IDHashFirst));

	// Proceed from last to first so that lower targets appear first
	for (int i = allTags.Size() - 1; i >= 0; i--)
	{
		if (allTags[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allTags[i].tag) % FTagManager::TAG_HASH_SIZE;
			allTags[i].nexttag = TagHashFirst[hash];
			TagHashFirst[hash] = i;
		}
	}

	for (int i = allIDs.Size() - 1; i >= 0; i--)
	{
		if (allIDs[i].target >= 0)	// only link valid entries
		{
			int hash = ((unsigned int)allIDs[i].tag) % FTagManager::TAG_HASH_SIZE;
			allIDs[i].nexttag = IDHashFirst[hash];
			IDHashFirst[hash] = i;
		}
	}

}